

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

CVmGramProdMatch *
CVmGramProdMatch::alloc
          (CVmGramProdMem *mem,size_t tok_pos,vm_val_t *tok_match_result,int matched_star,
          vm_prop_id_t target_prop,vm_obj_id_t proc_obj,CVmGramProdMatch **sub_match_list,
          size_t sub_match_cnt)

{
  CVmGramProdMatch *pCVar1;
  int in_ECX;
  undefined8 *in_RDX;
  size_t in_RSI;
  vm_prop_id_t in_R8W;
  vm_obj_id_t in_R9D;
  CVmGramProdMatch *match;
  undefined4 in_stack_00000010;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  pCVar1 = (CVmGramProdMatch *)
           CVmGramProdMem::alloc
                     ((CVmGramProdMem *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0);
  pCVar1->tok_pos_ = in_RSI;
  pCVar1->matched_star_ = in_ECX;
  pCVar1->target_prop_ = in_R8W;
  pCVar1->proc_obj_ = in_R9D;
  pCVar1->sub_match_list_ = (CVmGramProdMatch **)match;
  pCVar1->sub_match_cnt_ = CONCAT44(proc_obj,in_stack_00000010);
  if (in_RDX == (undefined8 *)0x0) {
    vm_val_t::set_nil(&pCVar1->tok_match_result_);
  }
  else {
    *(undefined8 *)&pCVar1->tok_match_result_ = *in_RDX;
    (pCVar1->tok_match_result_).val = *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 1);
  }
  return pCVar1;
}

Assistant:

static CVmGramProdMatch *alloc(CVmGramProdMem *mem, size_t tok_pos,
                                   const vm_val_t *tok_match_result,
                                   int matched_star,
                                   vm_prop_id_t target_prop,
                                   vm_obj_id_t proc_obj,
                                   const CVmGramProdMatch **sub_match_list,
                                   size_t sub_match_cnt)
    {
        CVmGramProdMatch *match;
        
        /* allocate space */
        match = (CVmGramProdMatch *)mem->alloc(sizeof(CVmGramProdMatch));

        /* initialize */
        match->tok_pos_ = tok_pos;
        match->matched_star_ = matched_star;
        match->target_prop_ = target_prop;
        match->proc_obj_ = proc_obj;
        match->sub_match_list_ = sub_match_list;
        match->sub_match_cnt_ = sub_match_cnt;

        /* save the token match value, if one was given */
        if (tok_match_result != 0)
            match->tok_match_result_ = *tok_match_result;
        else
            match->tok_match_result_.set_nil();

        /* return the new match */
        return match;
    }